

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O1

void __thiscall Messages::Person::InternalSwap(Person *this,Person *other)

{
  undefined1 *this_00;
  ArenaStringPtr *pAVar1;
  ArenaStringPtr *pAVar2;
  uint32 uVar3;
  int32 iVar4;
  string *psVar5;
  UnknownFieldSet *other_00;
  Arena *pAVar6;
  
  this_00 = &other->field_0x8;
  if (((this->field_0x8 & 1) != 0) || ((*this_00 & 1) != 0)) {
    if ((*(ulong *)this_00 & 1) == 0) {
      other_00 = google::protobuf::internal::InternalMetadata::
                 mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                           ((InternalMetadata *)this_00);
    }
    else {
      other_00 = (UnknownFieldSet *)((*(ulong *)this_00 & 0xfffffffffffffffe) + 8);
    }
    google::protobuf::internal::InternalMetadata::DoSwap<google::protobuf::UnknownFieldSet>
              ((InternalMetadata *)&this->field_0x8,other_00);
  }
  uVar3 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar3;
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->phones_).super_RepeatedPtrFieldBase,
             &(other->phones_).super_RepeatedPtrFieldBase);
  pAVar1 = &this->name_;
  pAVar6 = *(Arena **)&this->field_0x8;
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  pAVar2 = &other->name_;
  if (pAVar1->ptr_ == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
  {
    if (pAVar2->ptr_ != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_
       ) {
      google::protobuf::internal::ArenaStringPtr::CreateInstance
                (pAVar1,pAVar6,
                 (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
      goto LAB_00109262;
    }
  }
  else {
LAB_00109262:
    psVar5 = pAVar1->ptr_;
    if (pAVar2->ptr_ == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_
       ) {
      google::protobuf::internal::ArenaStringPtr::CreateInstance
                (pAVar2,pAVar6,
                 (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)psVar5);
  }
  pAVar1 = &this->email_;
  pAVar6 = *(Arena **)&this->field_0x8;
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  pAVar2 = &other->email_;
  if (pAVar1->ptr_ == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
  {
    if (pAVar2->ptr_ == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_
       ) goto LAB_001092e3;
    google::protobuf::internal::ArenaStringPtr::CreateInstance
              (pAVar1,pAVar6,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  }
  psVar5 = pAVar1->ptr_;
  if (pAVar2->ptr_ == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
  {
    google::protobuf::internal::ArenaStringPtr::CreateInstance
              (pAVar2,pAVar6,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  }
  std::__cxx11::string::swap((string *)psVar5);
LAB_001092e3:
  iVar4 = this->id_;
  this->id_ = other->id_;
  other->id_ = iVar4;
  return;
}

Assistant:

void Person::InternalSwap(Person* other) {
  using std::swap;
  _internal_metadata_.Swap<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  phones_.InternalSwap(&other->phones_);
  name_.Swap(&other->name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  email_.Swap(&other->email_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  swap(id_, other->id_);
}